

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O3

void __thiscall util_tests::util_TrimString::test_method(util_TrimString *this)

{
  shared_ptr<boost::basic_wrap_stringstream<char>_> sVar1;
  shared_ptr<boost::basic_wrap_stringstream<char>_> sVar2;
  shared_ptr<boost::basic_wrap_stringstream<char>_> sVar3;
  int iVar4;
  void *pvVar5;
  size_type sVar6;
  undefined8 uVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *this_00;
  char *pcVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  iterator in_R8;
  iterator pvVar10;
  iterator in_R9;
  iterator pvVar11;
  char *pcVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  ulong uVar14;
  char *pcVar15;
  long in_FS_OFFSET;
  bool bVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  undefined1 *local_2d0;
  undefined1 *local_2c8;
  char *local_2c0;
  char *local_2b8;
  undefined1 *local_2b0;
  undefined1 *local_2a8;
  char *local_2a0;
  char *local_298;
  undefined1 *local_290;
  undefined1 *local_288;
  char *local_280;
  char *local_278;
  undefined1 *local_270;
  undefined1 *local_268;
  char *local_260;
  char *local_258;
  undefined1 *local_250;
  undefined1 *local_248;
  char *local_240;
  char *local_238;
  undefined1 *local_230;
  undefined1 *local_228;
  char *local_220;
  char *local_218;
  undefined1 *local_210;
  undefined1 *local_208;
  char *local_200;
  char *local_1f8;
  undefined1 *local_1f0;
  undefined1 *local_1e8;
  char *local_1e0;
  char *local_1d8;
  undefined1 *local_1d0;
  undefined1 *local_1c8;
  char *local_1c0;
  char *local_1b8;
  undefined1 *local_1b0;
  undefined1 *local_1a8;
  char *local_1a0;
  char *local_198;
  undefined1 *local_190;
  undefined1 *local_188;
  char *local_180;
  char *local_178;
  lazy_ostream local_170;
  undefined1 *local_160;
  char *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  char *local_140;
  char *local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_128;
  char *local_120;
  undefined1 local_118 [8];
  undefined1 local_110 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f8;
  undefined1 local_f0;
  undefined1 *local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  **local_e0;
  undefined1 local_d8 [16];
  undefined1 *local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  **local_c0;
  undefined1 local_b8 [8];
  undefined1 local_b0 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  undefined1 local_78 [8];
  undefined1 local_70 [12];
  undefined2 uStack_64;
  undefined1 uStack_62;
  undefined1 uStack_61;
  undefined1 local_60;
  undefined1 local_58 [8];
  undefined1 local_50 [12];
  undefined2 uStack_44;
  undefined1 uStack_42;
  undefined1 uStack_41;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar15 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_140 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_138 = "";
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x138;
  file.m_begin = (iterator)&local_140;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_150,msg);
  local_170.m_empty = false;
  local_170._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_160 = boost::unit_test::lazy_ostream::inst;
  local_158 = "";
  local_d8._0_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x9;
  pcVar12 = " foo bar ";
  local_d8._8_8_ = " foo bar ";
  uVar14 = 0;
  this_00 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0;
  do {
    pvVar5 = memchr(" \f\n\r\t\v",(int)this_00->_M_local_buf[0xf4abb3],6);
    if (pvVar5 == (void *)0x0) {
      paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_d8;
      sVar6 = std::basic_string_view<char,_std::char_traits<char>_>::find_last_not_of
                        ((basic_string_view<char,_std::char_traits<char>_> *)paVar9," \f\n\r\t\v",
                         0xffffffffffffffff,6);
      if ((ulong)local_d8._0_8_ < this_00) {
        if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_006ebb71;
        std::__throw_out_of_range_fmt
                  ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                   this_00);
        goto LAB_006eb6c9;
      }
      uVar14 = (sVar6 - (long)this_00) + 1;
      if ((ulong)(local_d8._0_8_ - (long)this_00) < uVar14) {
        uVar14 = local_d8._0_8_ - (long)this_00;
      }
      pcVar12 = this_00->_M_local_buf + local_d8._8_8_;
      goto LAB_006e9814;
    }
    this_00 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)((long)this_00 + 1);
  } while (this_00 !=
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x9);
  pcVar12 = (char *)0x0;
LAB_006e9814:
  local_58 = (undefined1  [8])(local_50 + 8);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,pcVar12,pcVar12 + uVar14);
  iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                     "foo bar");
  local_78[0] = iVar4 == 0;
  local_70._0_8_ = (element_type *)0x0;
  stack0xffffffffffffff98 = (sp_counted_base *)0x0;
  this_00 = &local_98;
  local_98._M_local_buf[0] = 'H';
  local_98._M_allocated_capacity._1_7_ = 0xf4a3;
  local_98._8_8_ =
       (long)
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
       + 99;
  local_c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              **)local_b8;
  local_d8._8_8_ = local_d8._8_8_ & 0xffffffffffffff00;
  local_d8._0_8_ = &PTR__lazy_ostream_01388fc8;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              **)local_118;
  local_118 = (undefined1  [8])0xf4abd5;
  local_f0 = 0;
  local_f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)&PTR__lazy_ostream_01389798;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x2;
  local_b8 = (undefined1  [8])local_58;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_78,&local_170,1,2,REQUIRE,0xf4abbd,(size_t)this_00,0x138,
             local_d8,"\"foo bar\"",&local_f8);
  boost::detail::shared_count::~shared_count((shared_count *)(local_70 + 8));
  if (local_58 != (undefined1  [8])(local_50 + 8)) {
    operator_delete((void *)local_58,
                    (ulong)((long)&stack0xffffffffffffffb8->_vptr_sp_counted_base + 1));
  }
  local_180 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_178 = "";
  local_190 = &boost::unit_test::basic_cstring<char_const>::null;
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x139;
  file_00.m_begin = (iterator)&local_180;
  msg_00.m_end = pvVar11;
  msg_00.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_190,
             msg_00);
  local_170.m_empty = false;
  local_170._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_160 = boost::unit_test::lazy_ostream::inst;
  local_158 = "";
  local_d8._0_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x29;
  pcVar15 = "\t \n  \n \f\n\r\t\v\tfoo \n \f\n\r\t\v\tbar\t  \n \f\n\r\t\v\t\n ";
  local_d8._8_8_ = "\t \n  \n \f\n\r\t\v\tfoo \n \f\n\r\t\v\tbar\t  \n \f\n\r\t\v\t\n ";
  paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
  do {
    pvVar5 = memchr(" \f\n\r\t\v",(int)(char)*(undefined1 *)((long)paVar9 + 0xf4abe7),6);
    if (pvVar5 == (void *)0x0) {
      pcVar12 = local_d8;
      sVar6 = std::basic_string_view<char,_std::char_traits<char>_>::find_last_not_of
                        ((basic_string_view<char,_std::char_traits<char>_> *)pcVar12," \f\n\r\t\v",
                         0xffffffffffffffff,6);
      if ((ulong)local_d8._0_8_ < paVar9) goto LAB_006eb6c9;
      uVar14 = (sVar6 - (long)paVar9) + 1;
      if ((ulong)(local_d8._0_8_ - (long)paVar9) < uVar14) {
        uVar14 = local_d8._0_8_ - (long)paVar9;
      }
      local_98._8_8_ = local_d8._8_8_ + (long)paVar9;
      local_98._M_local_buf[0] = (char)uVar14;
      local_98._M_allocated_capacity._1_7_ = (undefined7)(uVar14 >> 8);
      if (uVar14 == 0xf) {
        bVar16 = *(long *)(local_98._8_8_ + 7) == 0x726162090b090d0a &&
                 *(long *)local_98._8_8_ == 0xa0c200a206f6f66;
      }
      else {
        bVar16 = false;
      }
      goto LAB_006e9a97;
    }
    paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)((long)paVar9 + 1);
  } while (paVar9 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x29);
  local_98._M_local_buf[0] = '\0';
  local_98._M_allocated_capacity._1_7_ = 0;
  local_98._8_8_ = (long *)0x0;
  bVar16 = false;
LAB_006e9a97:
  local_58[0] = bVar16;
  local_50._0_8_ = (element_type *)0x0;
  stack0xffffffffffffffb8 = (sp_counted_base *)0x0;
  local_78 = (undefined1  [8])0xf4a348;
  local_70._0_8_ = (element_type *)0xf4a3ab;
  local_d8._8_8_ = local_d8._8_8_ & 0xffffffffffffff00;
  local_d8._0_8_ = &PTR__lazy_ostream_0138abe0;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              **)local_b8;
  local_118 = (undefined1  [8])0xf4ac66;
  local_f0 = 0;
  local_f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)&PTR__lazy_ostream_0138a770;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              **)local_118;
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x2;
  local_b8 = (undefined1  [8])this_00;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_58,&local_170,1,2,REQUIRE,0xf4ac11,(size_t)local_78,0x139,
             local_d8,"\"foo \\n \\f\\n\\r\\t\\v\\tbar\"",&local_f8);
  this_00 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_50 + 8);
  boost::detail::shared_count::~shared_count((shared_count *)&this_00->_M_allocated_capacity);
  local_1a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_198 = "";
  local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x13a;
  file_01.m_begin = (iterator)&local_1a0;
  msg_01.m_end = pvVar11;
  msg_01.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_1b0,
             msg_01);
  local_170.m_empty = false;
  local_170._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_160 = boost::unit_test::lazy_ostream::inst;
  local_158 = "";
  local_d8._0_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x11;
  local_d8._8_8_ = "\t \n foo \n\tbar\t \n ";
  pcVar15 = (char *)0x0;
  paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
  do {
    pvVar5 = memchr(" \f\n\r\t\v",(int)paVar9->_M_local_buf[0xf4ac8f],6);
    if (pvVar5 == (void *)0x0) {
      pcVar15 = local_d8;
      pcVar12 = (char *)std::basic_string_view<char,_std::char_traits<char>_>::find_last_not_of
                                  ((basic_string_view<char,_std::char_traits<char>_> *)pcVar15,
                                   " \f\n\r\t\v",0xffffffffffffffff,6);
      if ((ulong)local_d8._0_8_ < paVar9) goto LAB_006eb6f8;
      pcVar15 = pcVar12 + (1 - (long)paVar9);
      if ((char *)(local_d8._0_8_ - (long)paVar9) < pcVar12 + (1 - (long)paVar9)) {
        pcVar15 = (char *)(local_d8._0_8_ - (long)paVar9);
      }
      pcVar12 = paVar9->_M_local_buf + local_d8._8_8_;
      goto LAB_006e9c93;
    }
    paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)((long)paVar9 + 1);
  } while (paVar9 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x11);
  pcVar12 = (char *)0x0;
LAB_006e9c93:
  local_58 = (undefined1  [8])this_00;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_58,pcVar12,pcVar15 + (long)pcVar12);
  iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                     "foo \n\tbar");
  local_78[0] = iVar4 == 0;
  local_70._0_8_ = (element_type *)0x0;
  stack0xffffffffffffff98 = (sp_counted_base *)0x0;
  paVar9 = &local_98;
  local_98._M_local_buf[0] = 'H';
  local_98._M_allocated_capacity._1_7_ = 0xf4a3;
  local_98._8_8_ =
       (long)
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
       + 99;
  local_d8._8_8_ = local_d8._8_8_ & 0xffffffffffffff00;
  local_d8._0_8_ = &PTR__lazy_ostream_01388fc8;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              **)local_b8;
  local_118 = (undefined1  [8])0xf4acc7;
  local_f0 = 0;
  local_f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)&PTR__lazy_ostream_01389758;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              **)local_118;
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x2;
  local_b8 = (undefined1  [8])local_58;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_78,&local_170,1,2,REQUIRE,0xf4aca1,(size_t)paVar9,0x13a,
             local_d8,"\"foo \\n\\tbar\"",&local_f8);
  boost::detail::shared_count::~shared_count((shared_count *)(local_70 + 8));
  if (local_58 != (undefined1  [8])this_00) {
    operator_delete((void *)local_58,
                    (ulong)((long)&stack0xffffffffffffffb8->_vptr_sp_counted_base + 1));
  }
  local_1c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  pcVar15 = "";
  local_1b8 = "";
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x13b;
  file_02.m_begin = (iterator)&local_1c0;
  msg_02.m_end = pvVar11;
  msg_02.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_1d0,
             msg_02);
  local_170.m_empty = false;
  local_170._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_160 = boost::unit_test::lazy_ostream::inst;
  local_158 = "";
  local_d8._0_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x11;
  local_d8._8_8_ = "\t \n foo \n\tbar\t \n ";
  this_00 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0;
  do {
    pvVar5 = memchr("fobar",(int)this_00->_M_local_buf[0xf4ac8f],5);
    if (pvVar5 == (void *)0x0) {
      pcVar12 = local_d8;
      sVar6 = std::basic_string_view<char,_std::char_traits<char>_>::find_last_not_of
                        ((basic_string_view<char,_std::char_traits<char>_> *)pcVar12,"fobar",
                         0xffffffffffffffff,5);
      if ((ulong)local_d8._0_8_ < this_00) goto LAB_006eb727;
      uVar14 = (sVar6 - (long)this_00) + 1;
      if ((ulong)(local_d8._0_8_ - (long)this_00) < uVar14) {
        uVar14 = local_d8._0_8_ - (long)this_00;
      }
      local_98._8_8_ = local_d8._8_8_ + (long)this_00;
      local_98._M_local_buf[0] = (char)uVar14;
      local_98._M_allocated_capacity._1_7_ = (undefined7)(uVar14 >> 8);
      if (uVar14 != 0x11) goto LAB_006e9f3d;
      auVar17[0] = -((char)*(long *)local_98._8_8_ == '\t');
      auVar17[1] = -(*(char *)(local_98._8_8_ + 1) == ' ');
      auVar17[2] = -(*(char *)(local_98._8_8_ + 2) == '\n');
      auVar17[3] = -(*(char *)(local_98._8_8_ + 3) == ' ');
      auVar17[4] = -(*(char *)(local_98._8_8_ + 4) == 'f');
      auVar17[5] = -(*(char *)(local_98._8_8_ + 5) == 'o');
      auVar17[6] = -(*(char *)(local_98._8_8_ + 6) == 'o');
      auVar17[7] = -(*(char *)(local_98._8_8_ + 7) == ' ');
      auVar17[8] = -((char)*(long *)(local_98._8_8_ + 8) == '\n');
      auVar17[9] = -(*(char *)(local_98._8_8_ + 9) == '\t');
      auVar17[10] = -(*(char *)(local_98._8_8_ + 10) == 'b');
      auVar17[0xb] = -(*(char *)(local_98._8_8_ + 0xb) == 'a');
      auVar17[0xc] = -(*(char *)(local_98._8_8_ + 0xc) == 'r');
      auVar17[0xd] = -(*(char *)(local_98._8_8_ + 0xd) == '\t');
      auVar17[0xe] = -(*(char *)(local_98._8_8_ + 0xe) == ' ');
      auVar17[0xf] = -(*(char *)(local_98._8_8_ + 0xf) == '\n');
      auVar18[0] = -((char)*(long *)(local_98._8_8_ + 0x10) == ' ');
      auVar18[1] = 0xff;
      auVar18[2] = 0xff;
      auVar18[3] = 0xff;
      auVar18[4] = 0xff;
      auVar18[5] = 0xff;
      auVar18[6] = 0xff;
      auVar18[7] = 0xff;
      auVar18[8] = 0xff;
      auVar18[9] = 0xff;
      auVar18[10] = 0xff;
      auVar18[0xb] = 0xff;
      auVar18[0xc] = 0xff;
      auVar18[0xd] = 0xff;
      auVar18[0xe] = 0xff;
      auVar18[0xf] = 0xff;
      auVar18 = auVar18 & auVar17;
      bVar16 = (ushort)((ushort)(SUB161(auVar18 >> 7,0) & 1) |
                        (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
                        (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
                        (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                        (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                        (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                        (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
                        (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
                        (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
                        (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
                        (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
                        (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
                        (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
                        (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
                        (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe |
                       (ushort)(byte)(auVar18[0xf] >> 7) << 0xf) == 0xffff;
      goto LAB_006e9f3f;
    }
    this_00 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)((long)this_00 + 1);
  } while (this_00 !=
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x11);
  local_98._M_local_buf[0] = '\0';
  local_98._M_allocated_capacity._1_7_ = 0;
  local_98._8_8_ = (long *)0x0;
LAB_006e9f3d:
  bVar16 = false;
LAB_006e9f3f:
  local_58[0] = bVar16;
  local_50._0_8_ = (element_type *)0x0;
  stack0xffffffffffffffb8 = (sp_counted_base *)0x0;
  local_78 = (undefined1  [8])0xf4a348;
  local_70._0_8_ = (element_type *)0xf4a3ab;
  local_d8._8_8_ = local_d8._8_8_ & 0xffffffffffffff00;
  local_d8._0_8_ = &PTR__lazy_ostream_0138abe0;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              **)local_b8;
  local_118 = (undefined1  [8])0xf4ac8f;
  local_f0 = 0;
  local_f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)&PTR__lazy_ostream_0138a730;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              **)local_118;
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x2;
  local_b8 = (undefined1  [8])paVar9;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_58,&local_170,1,2,REQUIRE,0xf4ace5,(size_t)local_78,0x13b,
             local_d8,"\"\\t \\n foo \\n\\tbar\\t \\n \"",&local_f8);
  pcVar15 = local_50 + 8;
  boost::detail::shared_count::~shared_count((shared_count *)pcVar15);
  local_1e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1d8 = "";
  local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x13c;
  file_03.m_begin = (iterator)&local_1e0;
  msg_03.m_end = pvVar11;
  msg_03.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_1f0,
             msg_03);
  local_170.m_empty = false;
  local_170._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_160 = boost::unit_test::lazy_ostream::inst;
  local_158 = "";
  local_d8._0_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x7;
  local_d8._8_8_ = "foo bar";
  pcVar12 = (char *)0x0;
  this_00 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0;
  do {
    pvVar5 = memchr(" \f\n\r\t\v",(int)this_00->_M_local_buf[0xf4abd5],6);
    if (pvVar5 == (void *)0x0) {
      pcVar12 = local_d8;
      paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)std::basic_string_view<char,_std::char_traits<char>_>::find_last_not_of
                            ((basic_string_view<char,_std::char_traits<char>_> *)pcVar12,
                             " \f\n\r\t\v",0xffffffffffffffff,6);
      if ((ulong)local_d8._0_8_ < this_00) goto LAB_006eb756;
      pcVar12 = paVar9->_M_local_buf + (1 - (long)this_00);
      if ((char *)(local_d8._0_8_ - (long)this_00) < paVar9->_M_local_buf + (1 - (long)this_00)) {
        pcVar12 = (char *)(local_d8._0_8_ - (long)this_00);
      }
      pcVar8 = this_00->_M_local_buf + local_d8._8_8_;
      goto LAB_006ea136;
    }
    this_00 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)((long)this_00 + 1);
  } while (this_00 !=
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x7);
  pcVar8 = (char *)0x0;
LAB_006ea136:
  local_58 = (undefined1  [8])pcVar15;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,pcVar8,pcVar12 + (long)pcVar8);
  iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                     "foo bar");
  local_78[0] = iVar4 == 0;
  local_70._0_8_ = (element_type *)0x0;
  stack0xffffffffffffff98 = (sp_counted_base *)0x0;
  pcVar12 = (char *)&local_98;
  local_98._M_local_buf[0] = 'H';
  local_98._M_allocated_capacity._1_7_ = 0xf4a3;
  local_98._8_8_ =
       (long)
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
       + 99;
  local_d8._8_8_ = local_d8._8_8_ & 0xffffffffffffff00;
  local_d8._0_8_ = &PTR__lazy_ostream_01388fc8;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              **)local_b8;
  local_118 = (undefined1  [8])0xf4abd5;
  local_f0 = 0;
  local_f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)&PTR__lazy_ostream_01389798;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              **)local_118;
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x2;
  local_b8 = (undefined1  [8])local_58;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_78,&local_170,1,2,REQUIRE,0xf4ad32,(size_t)pcVar12,0x13c,
             local_d8,"\"foo bar\"",&local_f8);
  this_00 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_70 + 8);
  boost::detail::shared_count::~shared_count((shared_count *)&this_00->_M_allocated_capacity);
  if (local_58 != (undefined1  [8])pcVar15) {
    operator_delete((void *)local_58,
                    (ulong)((long)&stack0xffffffffffffffb8->_vptr_sp_counted_base + 1));
  }
  local_200 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1f8 = "";
  local_210 = &boost::unit_test::basic_cstring<char_const>::null;
  local_208 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x13d;
  file_04.m_begin = (iterator)&local_200;
  msg_04.m_end = pvVar11;
  msg_04.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_210,
             msg_04);
  local_170.m_empty = false;
  local_170._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_160 = boost::unit_test::lazy_ostream::inst;
  local_158 = "";
  local_d8._0_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x7;
  local_d8._8_8_ = "foo bar";
  paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
  pcVar15 = "fobar";
  do {
    pvVar5 = memchr("fobar",(int)paVar9->_M_local_buf[0xf4abd5],5);
    if (pvVar5 == (void *)0x0) {
      sVar6 = std::basic_string_view<char,_std::char_traits<char>_>::find_last_not_of
                        ((basic_string_view<char,_std::char_traits<char>_> *)local_d8,"fobar",
                         0xffffffffffffffff,5);
      if ((ulong)local_d8._0_8_ < paVar9) goto LAB_006eb785;
      uVar14 = (sVar6 - (long)paVar9) + 1;
      if ((ulong)(local_d8._0_8_ - (long)paVar9) < uVar14) {
        uVar14 = local_d8._0_8_ - (long)paVar9;
      }
      local_98._8_8_ = local_d8._8_8_ + (long)paVar9;
      local_98._M_local_buf[0] = (char)uVar14;
      local_98._M_allocated_capacity._1_7_ = (undefined7)(uVar14 >> 8);
      if (uVar14 == 1) {
        bVar16 = (char)*(long *)local_98._8_8_ == ' ';
      }
      else {
        bVar16 = false;
      }
      goto LAB_006ea3bf;
    }
    paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)((long)paVar9 + 1);
  } while (paVar9 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x7);
  local_98._M_local_buf[0] = '\0';
  local_98._M_allocated_capacity._1_7_ = 0;
  local_98._8_8_ = (long *)0x0;
  bVar16 = false;
LAB_006ea3bf:
  local_58[0] = bVar16;
  local_50._0_8_ = (element_type *)0x0;
  stack0xffffffffffffffb8 = (sp_counted_base *)0x0;
  local_78 = (undefined1  [8])0xf4a348;
  local_70._0_8_ = (element_type *)0xf4a3ab;
  local_d8._8_8_ = local_d8._8_8_ & 0xffffffffffffff00;
  local_d8._0_8_ = &PTR__lazy_ostream_0138abe0;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              **)local_b8;
  local_118 = (undefined1  [8])0xe39fae;
  local_f0 = 0;
  local_f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)&PTR__lazy_ostream_01389698;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              **)local_118;
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x2;
  local_b8 = (undefined1  [8])pcVar12;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_58,&local_170,1,2,REQUIRE,0xf4ad48,(size_t)local_78,0x13d,
             local_d8,"\" \"",&local_f8);
  boost::detail::shared_count::~shared_count((shared_count *)(local_50 + 8));
  local_220 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_218 = "";
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  local_228 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x13e;
  file_05.m_begin = (iterator)&local_220;
  msg_05.m_end = pvVar11;
  msg_05.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_230,
             msg_05);
  pcVar8 = (char *)0x0;
  local_170.m_empty = false;
  local_170._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_160 = boost::unit_test::lazy_ostream::inst;
  local_158 = "";
  stack0xffffffffffffff98 = (sp_counted_base *)0x2000206f6f662000;
  local_70._0_8_ = (element_type *)&DAT_00000008;
  local_60 = 0;
  local_d8._0_8_ = &DAT_00000008;
  paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
  local_d8._8_8_ = this_00;
  local_78 = (undefined1  [8])this_00;
  do {
    pvVar5 = memchr(" \f\n\r\t\v",(int)(char)(local_70 + 8)[(long)paVar9],6);
    if (pvVar5 == (void *)0x0) {
      pcVar15 = (char *)std::basic_string_view<char,_std::char_traits<char>_>::find_last_not_of
                                  ((basic_string_view<char,_std::char_traits<char>_> *)local_d8,
                                   " \f\n\r\t\v",0xffffffffffffffff,6);
      if ((ulong)local_d8._0_8_ < paVar9) goto LAB_006eb7b4;
      pcVar8 = pcVar15 + (1 - (long)paVar9);
      if ((char *)(local_d8._0_8_ - (long)paVar9) < pcVar15 + (1 - (long)paVar9)) {
        pcVar8 = (char *)(local_d8._0_8_ - (long)paVar9);
      }
      pcVar15 = paVar9->_M_local_buf + local_d8._8_8_;
      goto LAB_006ea5e0;
    }
    paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)((long)paVar9 + 1);
  } while (paVar9 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)&DAT_00000008);
  pcVar15 = (char *)0x0;
LAB_006ea5e0:
  local_58 = (undefined1  [8])(local_50 + 8);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,pcVar15,pcVar8 + (long)pcVar15)
  ;
  local_98._M_local_buf[0] = (char)&local_88;
  local_98._M_allocated_capacity._1_7_ = (undefined7)((ulong)&local_88 >> 8);
  local_88._M_allocated_capacity._0_2_ = 0x2000;
  local_88._M_local_buf[2] = 'f';
  local_88._M_local_buf[3] = 'o';
  local_88._M_allocated_capacity._4_2_ = 0x206f;
  local_88._M_local_buf[6] = '\0';
  local_98._8_8_ = (long *)0x7;
  local_88._M_local_buf[7] = '\0';
  if (local_50._0_8_ == 7) {
    bVar16 = *(int *)((long)local_58 + 3) == 0x206f6f && *(int *)local_58 == 0x6f662000;
  }
  else {
    bVar16 = false;
  }
  local_b8[0] = bVar16;
  local_b0._0_8_ = (element_type *)0x0;
  local_b0._8_8_ = (sp_counted_base *)0x0;
  pcVar15 = local_118;
  local_118 = (undefined1  [8])0xf4a348;
  local_110._0_8_ = "";
  local_c0 = &local_128;
  local_d8._8_8_ = local_d8._8_8_ & 0xffffffffffffff00;
  local_d8._0_8_ = &PTR__lazy_ostream_01388fc8;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = &local_100;
  local_f0 = 0;
  local_f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)&PTR__lazy_ostream_01388fc8;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x2;
  local_128 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58;
  local_100 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar12;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_b8,&local_170,1,2,REQUIRE,0xf4ad6b,(size_t)pcVar15,0x13e,
             local_d8,"std::string(\"\\0 foo \\0\", 7)",&local_f8);
  boost::detail::shared_count::~shared_count
            (&((shared_ptr<boost::basic_wrap_stringstream<char>_> *)local_b0)->pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_98._M_allocated_capacity._1_7_,local_98._M_local_buf[0]) != &local_88) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_98._M_allocated_capacity._1_7_,local_98._M_local_buf[0]),
                    CONCAT17(local_88._M_local_buf[7],
                             CONCAT16(local_88._M_local_buf[6],
                                      CONCAT24(local_88._M_allocated_capacity._4_2_,
                                               CONCAT13(local_88._M_local_buf[3],
                                                        CONCAT12(local_88._M_local_buf[2],
                                                                 local_88._M_allocated_capacity.
                                                                 _0_2_))))) + 1);
  }
  if (local_58 != (undefined1  [8])(local_50 + 8)) {
    operator_delete((void *)local_58,
                    (ulong)((long)&stack0xffffffffffffffb8->_vptr_sp_counted_base + 1));
  }
  if (local_78 != (undefined1  [8])this_00) {
    operator_delete((void *)local_78,
                    (ulong)((long)&stack0xffffffffffffff98->_vptr_sp_counted_base + 1));
  }
  local_240 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_238 = "";
  local_250 = &boost::unit_test::basic_cstring<char_const>::null;
  local_248 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x13f;
  file_06.m_begin = (iterator)&local_240;
  msg_06.m_end = pvVar11;
  msg_06.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_250,
             msg_06);
  sVar1 = _local_50;
  local_170.m_empty = false;
  local_170._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_160 = boost::unit_test::lazy_ostream::inst;
  local_158 = "";
  local_d8._8_8_ = local_50 + 8;
  local_50._8_4_ = 0x6f6f6620;
  _uStack_42 = sVar1.pn.pi_._6_2_;
  uStack_44 = 0x20;
  local_50._0_8_ = (element_type *)0x5;
  local_d8._0_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x5;
  paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0;
  paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
  local_58 = (undefined1  [8])local_d8._8_8_;
  do {
    pvVar5 = memchr(" \f\n\r\t\v",(int)(char)(local_50 + 8)[(long)paVar9],6);
    if (pvVar5 == (void *)0x0) {
      pcVar12 = (char *)std::basic_string_view<char,_std::char_traits<char>_>::find_last_not_of
                                  ((basic_string_view<char,_std::char_traits<char>_> *)local_d8,
                                   " \f\n\r\t\v",0xffffffffffffffff,6);
      if ((ulong)local_d8._0_8_ < paVar9) goto LAB_006eb7e3;
      paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(pcVar12 + (1 - (long)paVar9));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_d8._0_8_ - (long)paVar9) <
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(pcVar12 + (1 - (long)paVar9))) {
        paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_d8._0_8_ - (long)paVar9);
      }
      local_110._0_8_ = local_d8._8_8_ + (long)paVar9;
      goto LAB_006ea8e7;
    }
    paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)((long)paVar9 + 1);
  } while (paVar9 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x5);
  local_110._0_8_ = (short *)0x0;
LAB_006ea8e7:
  local_70._8_4_ = 0x6f6f66;
  local_70._0_8_ = (element_type *)0x3;
  if (paVar13 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x3) {
    local_98._M_local_buf[0] =
         (char)*(short *)(local_110._0_8_ + 2) == 'o' && *(short *)local_110._0_8_ == 0x6f66;
  }
  else {
    local_98._M_local_buf[0] = false;
  }
  pcVar12 = (char *)&local_98;
  local_98._8_8_ = (long *)0x0;
  local_88._M_allocated_capacity._0_2_ = 0;
  local_88._M_local_buf[2] = '\0';
  local_88._M_local_buf[3] = '\0';
  local_88._M_allocated_capacity._4_2_ = 0;
  local_88._M_local_buf[6] = '\0';
  local_88._M_local_buf[7] = '\0';
  local_b8 = (undefined1  [8])0xf4a348;
  local_b0._0_8_ = (element_type *)0xf4a3ab;
  local_d8._8_8_ = local_d8._8_8_ & 0xffffffffffffff00;
  local_d8._0_8_ = &PTR__lazy_ostream_0138abe0;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_c0 = &local_128;
  local_100 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78;
  local_f0 = 0;
  local_f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)&PTR__lazy_ostream_01388fc8;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = &local_100;
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x2;
  local_128 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar15;
  local_118 = (undefined1  [8])paVar13;
  local_78 = (undefined1  [8])this_00;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)pcVar12,&local_170,1,2,REQUIRE,0xf4adb6,(size_t)local_b8,0x13f,
             local_d8,"std::string(\"foo\", 3)",&local_f8);
  pcVar15 = (char *)&local_88;
  boost::detail::shared_count::~shared_count((shared_count *)pcVar15);
  if (local_78 != (undefined1  [8])this_00) {
    operator_delete((void *)local_78,
                    (ulong)((long)&stack0xffffffffffffff98->_vptr_sp_counted_base + 1));
  }
  if (local_58 != (undefined1  [8])(local_50 + 8)) {
    operator_delete((void *)local_58,
                    (ulong)((long)&stack0xffffffffffffffb8->_vptr_sp_counted_base + 1));
  }
  local_260 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_258 = "";
  local_270 = &boost::unit_test::basic_cstring<char_const>::null;
  local_268 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x140;
  file_07.m_begin = (iterator)&local_260;
  msg_07.m_end = pvVar11;
  msg_07.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_270,
             msg_07);
  sVar1 = _local_70;
  uVar14 = 0;
  local_170.m_empty = false;
  local_170._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_160 = boost::unit_test::lazy_ostream::inst;
  local_158 = "";
  local_70._8_4_ = 0x909;
  _uStack_62 = sVar1.pn.pi_._6_2_;
  uStack_64 = 0xa0a;
  local_70._0_8_ = (element_type *)0x6;
  sVar2 = _local_70;
  uStack_61 = sVar1.pn.pi_._7_1_;
  _local_70 = sVar2._0_14_;
  uStack_62 = 0;
  local_d8._0_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x6;
  paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
  local_d8._8_8_ = this_00;
  local_78 = (undefined1  [8])this_00;
  do {
    pvVar5 = memchr(" \f\n\r\t\v",(int)(char)(local_70 + 8)[(long)paVar9],6);
    if (pvVar5 == (void *)0x0) {
      sVar6 = std::basic_string_view<char,_std::char_traits<char>_>::find_last_not_of
                        ((basic_string_view<char,_std::char_traits<char>_> *)local_d8," \f\n\r\t\v",
                         0xffffffffffffffff,6);
      if ((ulong)local_d8._0_8_ < paVar9) goto LAB_006eb812;
      uVar14 = (sVar6 - (long)paVar9) + 1;
      if ((ulong)(local_d8._0_8_ - (long)paVar9) < uVar14) {
        uVar14 = local_d8._0_8_ - (long)paVar9;
      }
      pcVar8 = paVar9->_M_local_buf + local_d8._8_8_;
      goto LAB_006eabb8;
    }
    paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)((long)paVar9 + 1);
  } while (paVar9 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x6);
  pcVar8 = (char *)0x0;
LAB_006eabb8:
  local_58 = (undefined1  [8])(local_50 + 8);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,pcVar8,pcVar8 + uVar14);
  local_98._M_local_buf[0] = (char)pcVar15;
  local_98._M_allocated_capacity._1_7_ = (undefined7)((ulong)pcVar15 >> 8);
  local_88._M_allocated_capacity._0_2_ = 0;
  local_98._8_8_ = (long *)0x2;
  local_88._M_local_buf[2] = '\0';
  if (local_50._0_8_ == 2) {
    bVar16 = *(short *)local_58 == 0;
  }
  else {
    bVar16 = false;
  }
  local_b8[0] = bVar16;
  local_b0._0_8_ = (element_type *)0x0;
  local_b0._8_8_ = (sp_counted_base *)0x0;
  paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_118;
  local_118 = (undefined1  [8])0xf4a348;
  local_110._0_8_ = "";
  local_d8._8_8_ = local_d8._8_8_ & 0xffffffffffffff00;
  local_d8._0_8_ = &PTR__lazy_ostream_01388fc8;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_c0 = &local_128;
  local_f0 = 0;
  local_f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)&PTR__lazy_ostream_01388fc8;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = &local_100;
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x2;
  local_128 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58;
  local_100 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar12;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_b8,&local_170,1,2,REQUIRE,0xf4adf4,(size_t)paVar9,0x140,
             local_d8,"std::string(\"\\0\\0\", 2)",&local_f8);
  boost::detail::shared_count::~shared_count
            (&((shared_ptr<boost::basic_wrap_stringstream<char>_> *)local_b0)->pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_98._M_allocated_capacity._1_7_,local_98._M_local_buf[0]) !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar15) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_98._M_allocated_capacity._1_7_,local_98._M_local_buf[0]),
                    CONCAT17(local_88._M_local_buf[7],
                             CONCAT16(local_88._M_local_buf[6],
                                      CONCAT24(local_88._M_allocated_capacity._4_2_,
                                               CONCAT13(local_88._M_local_buf[3],
                                                        CONCAT12(local_88._M_local_buf[2],
                                                                 local_88._M_allocated_capacity.
                                                                 _0_2_))))) + 1);
  }
  if (local_58 != (undefined1  [8])(local_50 + 8)) {
    operator_delete((void *)local_58,
                    (ulong)((long)&stack0xffffffffffffffb8->_vptr_sp_counted_base + 1));
  }
  if (local_78 != (undefined1  [8])this_00) {
    operator_delete((void *)local_78,
                    (ulong)((long)&stack0xffffffffffffff98->_vptr_sp_counted_base + 1));
  }
  local_280 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_278 = "";
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  local_288 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x141;
  file_08.m_begin = (iterator)&local_280;
  msg_08.m_end = pvVar11;
  msg_08.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_290,
             msg_08);
  sVar1 = _local_50;
  paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0;
  local_170.m_empty = false;
  local_170._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_160 = boost::unit_test::lazy_ostream::inst;
  local_158 = "";
  local_d8._8_8_ = local_50 + 8;
  local_50._8_4_ = 0x2030405;
  _uStack_42 = sVar1.pn.pi_._6_2_;
  uStack_44 = 1;
  local_50._0_8_ = (element_type *)0x6;
  sVar2 = _local_50;
  uStack_41 = sVar1.pn.pi_._7_1_;
  _local_50 = sVar2._0_14_;
  uStack_42 = 0;
  local_d8._0_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x6;
  pcVar12 = (char *)0x0;
  local_58 = (undefined1  [8])local_d8._8_8_;
  do {
    pvVar5 = memchr(" \f\n\r\t\v",(int)(char)(local_50 + 8)[(long)pcVar12],6);
    if (pvVar5 == (void *)0x0) {
      pcVar15 = (char *)std::basic_string_view<char,_std::char_traits<char>_>::find_last_not_of
                                  ((basic_string_view<char,_std::char_traits<char>_> *)local_d8,
                                   " \f\n\r\t\v",0xffffffffffffffff,6);
      if ((ulong)local_d8._0_8_ < pcVar12) goto LAB_006eb841;
      paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(pcVar15 + (1 - (long)pcVar12));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_d8._0_8_ - (long)pcVar12) <
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(pcVar15 + (1 - (long)pcVar12))) {
        paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_d8._0_8_ - (long)pcVar12);
      }
      local_110._0_8_ = local_d8._8_8_ + (long)pcVar12;
      goto LAB_006eaebd;
    }
    pcVar12 = (char *)((long)pcVar12 + 1);
  } while (pcVar12 != (undefined1 *)0x6);
  local_110._0_8_ = (int *)0x0;
LAB_006eaebd:
  sVar1 = _local_70;
  local_70._8_4_ = 0x2030405;
  _uStack_62 = sVar1.pn.pi_._6_2_;
  uStack_64 = 1;
  local_70._0_8_ = (element_type *)0x6;
  sVar2 = _local_70;
  uStack_61 = sVar1.pn.pi_._7_1_;
  _local_70 = sVar2._0_14_;
  uStack_62 = 0;
  if (paVar13 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x6) {
    local_98._M_local_buf[0] =
         (short)*(int *)(local_110._0_8_ + 4) == 1 && *(int *)local_110._0_8_ == 0x2030405;
  }
  else {
    local_98._M_local_buf[0] = false;
  }
  local_98._8_8_ = 0;
  local_88._M_allocated_capacity._0_2_ = 0;
  local_88._M_local_buf[2] = '\0';
  local_88._M_local_buf[3] = '\0';
  local_88._M_allocated_capacity._4_2_ = 0;
  local_88._M_local_buf[6] = '\0';
  local_88._M_local_buf[7] = '\0';
  local_b8 = (undefined1  [8])0xf4a348;
  local_b0._0_8_ = (element_type *)0xf4a3ab;
  local_d8._8_8_ = local_d8._8_8_ & 0xffffffffffffff00;
  local_d8._0_8_ = &PTR__lazy_ostream_0138abe0;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_c0 = &local_128;
  local_100 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78;
  local_f0 = 0;
  local_f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)&PTR__lazy_ostream_01388fc8;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = &local_100;
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x2;
  local_128 = paVar9;
  local_118 = (undefined1  [8])paVar13;
  local_78 = (undefined1  [8])this_00;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_98,&local_170,1,2,REQUIRE,0xf4ae36,(size_t)local_b8,0x141,
             local_d8,"std::string(\"\\x05\\x04\\x03\\x02\\x01\\x00\", 6)",&local_f8);
  pcVar15 = (char *)&local_88;
  boost::detail::shared_count::~shared_count((shared_count *)pcVar15);
  if (local_78 != (undefined1  [8])this_00) {
    operator_delete((void *)local_78,
                    (ulong)((long)&stack0xffffffffffffff98->_vptr_sp_counted_base + 1));
  }
  if (local_58 != (undefined1  [8])(local_50 + 8)) {
    operator_delete((void *)local_58,
                    (ulong)((long)&stack0xffffffffffffffb8->_vptr_sp_counted_base + 1));
  }
  local_2a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_298 = "";
  local_2b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x142;
  file_09.m_begin = (iterator)&local_2a0;
  msg_09.m_end = pvVar11;
  msg_09.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_2b0,
             msg_09);
  sVar1 = _local_70;
  uVar14 = 0;
  local_170.m_empty = false;
  local_170._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_160 = boost::unit_test::lazy_ostream::inst;
  local_158 = "";
  local_70._8_4_ = 0x2030405;
  _uStack_62 = sVar1.pn.pi_._6_2_;
  uStack_64 = 1;
  local_70._0_8_ = (element_type *)0x6;
  sVar2 = _local_70;
  uStack_61 = sVar1.pn.pi_._7_1_;
  _local_70 = sVar2._0_14_;
  uStack_62 = 0;
  local_98._M_local_buf[0] = (char)pcVar15;
  local_98._M_allocated_capacity._1_7_ = (undefined7)((ulong)pcVar15 >> 8);
  local_88._M_allocated_capacity._0_2_ = 0x405;
  local_88._M_local_buf[2] = '\x03';
  local_88._M_local_buf[3] = '\x02';
  local_88._M_allocated_capacity._4_2_ = 1;
  local_98._8_8_ = (long *)0x5;
  local_d8._0_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x6;
  paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
  local_d8._8_8_ = this_00;
  local_78 = (undefined1  [8])this_00;
  do {
    pvVar5 = memchr(pcVar15,(int)(char)(local_70 + 8)[(long)paVar9],5);
    if (pvVar5 == (void *)0x0) {
      sVar6 = std::basic_string_view<char,_std::char_traits<char>_>::find_last_not_of
                        ((basic_string_view<char,_std::char_traits<char>_> *)local_d8,pcVar15,
                         0xffffffffffffffff,5);
      if ((ulong)local_d8._0_8_ < paVar9) goto LAB_006eb870;
      uVar14 = (sVar6 - (long)paVar9) + 1;
      if ((ulong)(local_d8._0_8_ - (long)paVar9) < uVar14) {
        uVar14 = local_d8._0_8_ - (long)paVar9;
      }
      pcVar12 = paVar9->_M_local_buf + local_d8._8_8_;
      goto LAB_006eb1c8;
    }
    paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)((long)paVar9 + 1);
  } while (paVar9 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x6);
  pcVar12 = (char *)0x0;
LAB_006eb1c8:
  local_58 = (undefined1  [8])(local_50 + 8);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,pcVar12,pcVar12 + uVar14);
  local_b8 = (undefined1  [8])&((shared_ptr<boost::basic_wrap_stringstream<char>_> *)local_b0)->pn;
  local_b0._8_2_ = 0;
  local_b0._0_8_ = (element_type *)0x1;
  if (local_50._0_8_ == 1) {
    bVar16 = *(char *)local_58 == '\0';
  }
  else {
    bVar16 = false;
  }
  local_118[0] = bVar16;
  local_110 = (undefined1  [16])0x0;
  local_128 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0xf4a348;
  local_120 = "";
  local_d8._8_8_ = local_d8._8_8_ & 0xffffffffffffff00;
  local_d8._0_8_ = &PTR__lazy_ostream_01388fc8;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_c0 = &local_100;
  local_e0 = &local_130;
  local_f0 = 0;
  local_f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)&PTR__lazy_ostream_01388fc8;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x2;
  local_130 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8;
  local_100 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_118,&local_170,1,2,REQUIRE,0xf4aea2,(size_t)&local_128,0x142,
             local_d8,"std::string(\"\\0\", 1)",&local_f8);
  boost::detail::shared_count::~shared_count((shared_count *)(local_118 + 0x10));
  if (local_b8 !=
      (undefined1  [8])&((shared_ptr<boost::basic_wrap_stringstream<char>_> *)local_b0)->pn) {
    operator_delete((void *)local_b8,(ulong)((long)(_func_int ***)local_b0._8_8_ + 1));
  }
  if (local_58 != (undefined1  [8])(local_50 + 8)) {
    operator_delete((void *)local_58,
                    (ulong)((long)&stack0xffffffffffffffb8->_vptr_sp_counted_base + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_98._M_allocated_capacity._1_7_,local_98._M_local_buf[0]) !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar15) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_98._M_allocated_capacity._1_7_,local_98._M_local_buf[0]),
                    CONCAT17(local_88._M_local_buf[7],
                             CONCAT16(local_88._M_local_buf[6],
                                      CONCAT24(local_88._M_allocated_capacity._4_2_,
                                               CONCAT13(local_88._M_local_buf[3],
                                                        CONCAT12(local_88._M_local_buf[2],
                                                                 local_88._M_allocated_capacity.
                                                                 _0_2_))))) + 1);
  }
  if (local_78 != (undefined1  [8])this_00) {
    operator_delete((void *)local_78,
                    (ulong)((long)&stack0xffffffffffffff98->_vptr_sp_counted_base + 1));
  }
  local_2c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_2b8 = "";
  local_2d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x143;
  file_10.m_begin = (iterator)&local_2c0;
  msg_10.m_end = pvVar11;
  msg_10.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_2d0,
             msg_10);
  sVar2 = _local_50;
  sVar1 = _local_70;
  paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
  local_170.m_empty = false;
  local_170._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_160 = boost::unit_test::lazy_ostream::inst;
  local_158 = "";
  local_d8._8_8_ = local_50 + 8;
  local_50._8_4_ = 0x2030405;
  _uStack_42 = sVar2.pn.pi_._6_2_;
  uStack_44 = 1;
  local_50._0_8_ = (element_type *)0x6;
  sVar3 = _local_50;
  uStack_41 = sVar2.pn.pi_._7_1_;
  _local_50 = sVar3._0_14_;
  uStack_42 = 0;
  local_70._8_4_ = 0x2030405;
  _uStack_62 = sVar1.pn.pi_._6_2_;
  uStack_64 = 1;
  local_70._0_8_ = (element_type *)0x6;
  sVar2 = _local_70;
  uStack_61 = sVar1.pn.pi_._7_1_;
  _local_70 = sVar2._0_14_;
  uStack_62 = 0;
  local_d8._0_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x6;
  pcVar15 = (char *)0x0;
  local_78 = (undefined1  [8])this_00;
  local_58 = (undefined1  [8])local_d8._8_8_;
  do {
    pvVar5 = memchr(this_00,(int)(char)(local_50 + 8)[(long)pcVar15],6);
    if (pvVar5 == (void *)0x0) {
      sVar6 = std::basic_string_view<char,_std::char_traits<char>_>::find_last_not_of
                        ((basic_string_view<char,_std::char_traits<char>_> *)local_d8,
                         this_00->_M_local_buf,0xffffffffffffffff,6);
      if ((ulong)local_d8._0_8_ < pcVar15) goto LAB_006eb89f;
      paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)((sVar6 - (long)pcVar15) + 1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_d8._0_8_ - (long)pcVar15) < paVar9) {
        paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(local_d8._0_8_ - (long)pcVar15);
      }
      local_110._0_8_ = local_d8._8_8_ + (long)pcVar15;
      goto LAB_006eb517;
    }
    pcVar15 = (char *)((long)pcVar15 + 1);
  } while (pcVar15 != (undefined1 *)0x6);
  local_110._0_8_ = (undefined1 *)0x0;
LAB_006eb517:
  local_98._M_local_buf[0] =
       paVar9 == (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
  local_98._8_8_ = (long *)0x0;
  local_88._M_allocated_capacity._0_2_ = 0;
  local_88._M_local_buf[2] = '\0';
  local_88._M_local_buf[3] = '\0';
  local_88._M_allocated_capacity._4_2_ = 0;
  local_88._M_local_buf[6] = '\0';
  local_88._M_local_buf[7] = '\0';
  local_b8 = (undefined1  [8])0xf4a348;
  local_b0._0_8_ = (element_type *)0xf4a3ab;
  local_d8._8_8_ = local_d8._8_8_ & 0xffffffffffffff00;
  local_d8._0_8_ = &PTR__lazy_ostream_0138abe0;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_100 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0xf4aea1;
  local_f0 = 0;
  local_f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)&PTR__lazy_ostream_01389558;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = &local_100;
  local_128 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118;
  local_118 = (undefined1  [8])paVar9;
  local_c0 = &local_128;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_98,&local_170,1,2,REQUIRE,0xf4af16,(size_t)local_b8,0x143,
             local_d8,"\"\"",&local_f8);
  boost::detail::shared_count::~shared_count((shared_count *)&local_88._M_allocated_capacity);
  if (local_78 != (undefined1  [8])this_00) {
    operator_delete((void *)local_78,
                    (ulong)((long)&stack0xffffffffffffff98->_vptr_sp_counted_base + 1));
  }
  if (local_58 != (undefined1  [8])(local_50 + 8)) {
    operator_delete((void *)local_58,
                    (ulong)((long)&stack0xffffffffffffffb8->_vptr_sp_counted_base + 1));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_006ebb71:
  __stack_chk_fail();
LAB_006eb6c9:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    std::__throw_out_of_range_fmt
              ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",paVar9
              );
LAB_006eb6f8:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      std::__throw_out_of_range_fmt
                ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                 paVar9);
LAB_006eb727:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        std::__throw_out_of_range_fmt
                  ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                   this_00);
LAB_006eb756:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          std::__throw_out_of_range_fmt
                    ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                     this_00);
LAB_006eb785:
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            std::__throw_out_of_range_fmt
                      ("%s: __pos (which is %zu) > __size (which is %zu)",
                       "basic_string_view::substr",paVar9);
LAB_006eb7b4:
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              std::__throw_out_of_range_fmt
                        ("%s: __pos (which is %zu) > __size (which is %zu)",
                         "basic_string_view::substr",paVar9);
LAB_006eb7e3:
              if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                std::__throw_out_of_range_fmt
                          ("%s: __pos (which is %zu) > __size (which is %zu)",
                           "basic_string_view::substr",paVar9);
LAB_006eb812:
                if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                  std::__throw_out_of_range_fmt
                            ("%s: __pos (which is %zu) > __size (which is %zu)",
                             "basic_string_view::substr",paVar9);
LAB_006eb841:
                  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                    std::__throw_out_of_range_fmt
                              ("%s: __pos (which is %zu) > __size (which is %zu)",
                               "basic_string_view::substr",pcVar12);
LAB_006eb870:
                    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                      std::__throw_out_of_range_fmt
                                ("%s: __pos (which is %zu) > __size (which is %zu)",
                                 "basic_string_view::substr",paVar9);
LAB_006eb89f:
                      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                        uVar7 = std::__throw_out_of_range_fmt
                                          ("%s: __pos (which is %zu) > __size (which is %zu)",
                                           "basic_string_view::substr",pcVar15);
                        if (local_78 != (undefined1  [8])this_00) {
                          operator_delete((void *)local_78,
                                          (ulong)((long)&stack0xffffffffffffff98->
                                                         _vptr_sp_counted_base + 1));
                        }
                        if (local_58 != (undefined1  [8])(local_50 + 8)) {
                          operator_delete((void *)local_58,
                                          (ulong)((long)&stack0xffffffffffffffb8->
                                                         _vptr_sp_counted_base + 1));
                        }
                        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                          _Unwind_Resume(uVar7);
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  goto LAB_006ebb71;
}

Assistant:

BOOST_AUTO_TEST_CASE(util_TrimString)
{
    BOOST_CHECK_EQUAL(TrimString(" foo bar "), "foo bar");
    BOOST_CHECK_EQUAL(TrimStringView("\t \n  \n \f\n\r\t\v\tfoo \n \f\n\r\t\v\tbar\t  \n \f\n\r\t\v\t\n "), "foo \n \f\n\r\t\v\tbar");
    BOOST_CHECK_EQUAL(TrimString("\t \n foo \n\tbar\t \n "), "foo \n\tbar");
    BOOST_CHECK_EQUAL(TrimStringView("\t \n foo \n\tbar\t \n ", "fobar"), "\t \n foo \n\tbar\t \n ");
    BOOST_CHECK_EQUAL(TrimString("foo bar"), "foo bar");
    BOOST_CHECK_EQUAL(TrimStringView("foo bar", "fobar"), " ");
    BOOST_CHECK_EQUAL(TrimString(std::string("\0 foo \0 ", 8)), std::string("\0 foo \0", 7));
    BOOST_CHECK_EQUAL(TrimStringView(std::string(" foo ", 5)), std::string("foo", 3));
    BOOST_CHECK_EQUAL(TrimString(std::string("\t\t\0\0\n\n", 6)), std::string("\0\0", 2));
    BOOST_CHECK_EQUAL(TrimStringView(std::string("\x05\x04\x03\x02\x01\x00", 6)), std::string("\x05\x04\x03\x02\x01\x00", 6));
    BOOST_CHECK_EQUAL(TrimString(std::string("\x05\x04\x03\x02\x01\x00", 6), std::string("\x05\x04\x03\x02\x01", 5)), std::string("\0", 1));
    BOOST_CHECK_EQUAL(TrimStringView(std::string("\x05\x04\x03\x02\x01\x00", 6), std::string("\x05\x04\x03\x02\x01\x00", 6)), "");
}